

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_value_resource(jx9_value *pVal,void *pUserData)

{
  uint uVar1;
  
  jx9MemObjRelease(pVal);
  (pVal->x).pOther = pUserData;
  uVar1 = pVal->iFlags & 0xfffffe90U | 0x100;
  pVal->iFlags = uVar1;
  return uVar1;
}

Assistant:

JX9_PRIVATE int jx9_value_resource(jx9_value *pVal, void *pUserData)
{
	/* Invalidate any prior representation */
	jx9MemObjRelease(pVal);
	/* Reflect the new type */
	pVal->x.pOther = pUserData;
	MemObjSetType(pVal, MEMOBJ_RES);
	return JX9_OK;
}